

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O2

bool __thiscall iDynTree::XMLParser::parseXMLFile(XMLParser *this,string *absoluteFileName)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false> _Var6;
  string message;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  xmlCheckVersion(0x51b1);
  XMLParserState::resetState
            (&((this->m_pimpl)._M_t.
               super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
               .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>._M_head_impl)->
              m_parserState);
  _Var6._M_head_impl =
       (this->m_pimpl)._M_t.
       super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
       .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>._M_head_impl;
  if ((_Var6._M_head_impl)->m_performValidation == true) {
    if (*(size_type *)((long)&(_Var6._M_head_impl)->m_schemaLocation + 8) == 0) {
      iDynTree::reportError
                ("XMLParser","parseXMLFile","Validation requested, but no schema has been specified"
                );
      return false;
    }
    uVar3 = xmlSchemaNewParserCtxt((pointer)((_Var6._M_head_impl)->m_schemaLocation)._M_dataplus);
    uVar4 = xmlSchemaParse(uVar3);
    uVar5 = xmlSchemaNewValidCtxt(uVar4);
    iVar2 = xmlSchemaValidateFile(uVar5,(absoluteFileName->_M_dataplus)._M_p,0);
    xmlSchemaFreeValidCtxt(uVar5);
    xmlSchemaFree(uVar4);
    xmlSchemaFreeParserCtxt(uVar3);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Failed to validate ",&local_b1);
      std::operator+(&local_90,&local_b0,absoluteFileName);
      std::operator+(&local_70,&local_90," for schema ");
      std::operator+(&local_50,&local_70,
                     &((this->m_pimpl)._M_t.
                       super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                       .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>.
                      _M_head_impl)->m_schemaLocation);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      iDynTree::reportError("XMLParser","parseXMLFile",local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      return false;
    }
    _Var6._M_head_impl =
         (this->m_pimpl)._M_t.
         super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
         .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>._M_head_impl;
  }
  iVar2 = xmlSAXUserParseFile(_Var6._M_head_impl,this,(absoluteFileName->_M_dataplus)._M_p);
  if (iVar2 != 0) {
    return false;
  }
  bVar1 = XMLParserState::getParsingErrorState
                    (&((this->m_pimpl)._M_t.
                       super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                       .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>.
                      _M_head_impl)->m_parserState);
  return !bVar1;
}

Assistant:

bool XMLParser::parseXMLFile(std::string absoluteFileName)
    {
        assert(m_pimpl);
        LIBXML_TEST_VERSION

        // Reset the failure state.
        m_pimpl->m_parserState.resetState();
        
        if (m_pimpl->m_performValidation) {
            if (m_pimpl->m_schemaLocation.empty()) {
                reportError("XMLParser", "parseXMLFile", "Validation requested, but no schema has been specified");
                return false;
            }
            // Create necessary structures for the validator
            xmlSchemaParserCtxtPtr schemaParserContext = xmlSchemaNewParserCtxt(m_pimpl->m_schemaLocation.c_str());
            xmlSchemaPtr xmlSchema = xmlSchemaParse(schemaParserContext);
            xmlSchemaValidCtxtPtr validator = xmlSchemaNewValidCtxt(xmlSchema);
            
            // This is the actual validation. Note that there is the possibility to use
            // xmlSchemaSAXPlug which should perform the validation while parsing.
            // The code remains cleared in this way though, as the validation is optional.

            int validation = xmlSchemaValidateFile(validator, absoluteFileName.c_str(), 0);

            xmlSchemaFreeValidCtxt(validator);
            xmlSchemaFree(xmlSchema);
            xmlSchemaFreeParserCtxt(schemaParserContext);
            if (validation) {
                std::string message = std::string("Failed to validate ") + absoluteFileName + " for schema " + m_pimpl->m_schemaLocation;
                reportError("XMLParser", "parseXMLFile", message.c_str());
                return false;
            }
    
        }

//        xmlParserCtxtPtr parserContext = xmlCreatePushParserCtxt(m_pimpl->callbackHandler(),
//                                                                 this, NULL, 0, absoluteFileName.c_str());

        int result = xmlSAXUserParseFile(m_pimpl->callbackHandler(), this, absoluteFileName.c_str());
        return result == 0 && !m_pimpl->m_parserState.getParsingErrorState();
    }